

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O1

void select_free_selectop(selectop *sop)

{
  if (sop->event_readset_in != (fd_set *)0x0) {
    event_mm_free_(sop->event_readset_in);
  }
  if (sop->event_writeset_in != (fd_set *)0x0) {
    event_mm_free_(sop->event_writeset_in);
  }
  if (sop->event_readset_out != (fd_set *)0x0) {
    event_mm_free_(sop->event_readset_out);
  }
  if (sop->event_writeset_out != (fd_set *)0x0) {
    event_mm_free_(sop->event_writeset_out);
  }
  sop->event_readset_out = (fd_set *)0x0;
  sop->event_writeset_out = (fd_set *)0x0;
  sop->event_readset_in = (fd_set *)0x0;
  sop->event_writeset_in = (fd_set *)0x0;
  sop->event_fds = 0;
  sop->event_fdsz = 0;
  *(undefined8 *)&sop->resize_out_sets = 0;
  event_mm_free_(sop);
  return;
}

Assistant:

static void
select_free_selectop(struct selectop *sop)
{
	if (sop->event_readset_in)
		mm_free(sop->event_readset_in);
	if (sop->event_writeset_in)
		mm_free(sop->event_writeset_in);
	if (sop->event_readset_out)
		mm_free(sop->event_readset_out);
	if (sop->event_writeset_out)
		mm_free(sop->event_writeset_out);

	memset(sop, 0, sizeof(struct selectop));
	mm_free(sop);
}